

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

string * __thiscall
ListPanelItem::writeXml_abi_cxx11_(string *__return_storage_ptr__,ListPanelItem *this,int indent)

{
  char cVar1;
  ostream *poVar2;
  stringstream str;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Util::getIndent_abi_cxx11_(0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<ListPanelItem",0xe);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,">",1);
  cVar1 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"BackgroundColor","");
  Color::writeXml(&local_1f8,&this->backgroundColor,indent + 1,&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  Widget::writeXmlChildren(&this->super_Widget,(stringstream *)local_1b8,indent + 1);
  Util::getIndent_abi_cxx11_(0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</ListPanelItem>",0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string ListPanelItem::writeXml(int indent)
{
	std::stringstream str;

	str << Util::getIndent(indent) << "<ListPanelItem";
	writeXmlAttributes(str);
	str << ">" << std::endl;

	str << backgroundColor.writeXml(indent + 1, "BackgroundColor");

	writeXmlChildren(str, indent + 1);

	str << Util::getIndent(indent) << "</ListPanelItem>";
	return str.str();
}